

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

bool __thiscall QKeySequenceEdit::event(QKeySequenceEdit *this,QEvent *e)

{
  long lVar1;
  uint *puVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  
  sVar3 = *(short *)(e + 8);
  if (sVar3 == 6) {
    lVar4 = *(long *)(this + 8);
    uVar7 = QKeyEvent::modifiers();
    lVar5 = *(long *)(lVar4 + 0x298);
    if (lVar5 != 0) {
      lVar8 = 0;
      do {
        if (lVar5 << 2 == lVar8) goto LAB_0040ca20;
        lVar1 = lVar8 + 4;
        puVar2 = (uint *)(*(long *)(lVar4 + 0x290) + lVar8);
        lVar8 = lVar1;
      } while (*puVar2 != (uVar7 | *(uint *)(e + 0x40)));
      if (lVar1 != 0) goto LAB_0040ca10;
    }
LAB_0040ca20:
    (**(code **)(*(long *)this + 0xc0))(this,e);
  }
  else if (sVar3 != 0x75) {
    if (sVar3 != 0x33) {
LAB_0040ca10:
      bVar6 = QWidget::event((QWidget *)this,e);
      return bVar6;
    }
    e[0xc] = (QEvent)0x1;
  }
  return true;
}

Assistant:

bool QKeySequenceEdit::event(QEvent *e)
{
    Q_D(const QKeySequenceEdit);

    switch (e->type()) {
    case QEvent::Shortcut:
        return true;
    case QEvent::ShortcutOverride:
        e->accept();
        return true;
    case QEvent::KeyPress: {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if (!d->finishingKeyCombinations.contains(ke->keyCombination())) {
                keyPressEvent(ke);
                return true;
            }
        }
        break;
    default:
        break;
    }

    return QWidget::event(e);
}